

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_Pair_resize(ImVector_Pair *self,int new_size)

{
  int new_size_local;
  ImVector_Pair *self_local;
  
  ImVector<ImGuiStorage::ImGuiStoragePair>::resize(self,new_size);
  return;
}

Assistant:

CIMGUI_API void ImVector_Pair_resize(ImVector_Pair* self,int new_size)
{
    return self->resize(new_size);
}